

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O3

string * str_replPers(string *s)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __result;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  if (str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_,
                 "\\b[A-Z0-9._%+-]+@[A-Z0-9.-]+\\.[A-Z]{2,}\\b",1);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_);
    }
  }
  local_30 = 0;
  local_28 = 0;
  _Var1._M_current = (s->_M_dataplus)._M_p;
  local_38 = &local_28;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38,_Var1,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(_Var1._M_current + s->_M_string_length),
             &str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_,"[email@ano.nym]",0xf,0);
  std::__cxx11::string::operator=((string *)s,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  if (str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_,"\\/home\\/[-_\\.a-z]+\\/",
                 1);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_);
    }
  }
  local_30 = 0;
  local_28 = 0;
  _Var1._M_current = (s->_M_dataplus)._M_p;
  local_38 = &local_28;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38,_Var1,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(_Var1._M_current + s->_M_string_length),
             &str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_,"/home/[user]/",0xd,0);
  std::__cxx11::string::operator=((string *)s,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  if (str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_,
                 "[\\/\\\\]Users[\\/\\\\][-_\\.a-z]+[\\/\\\\]",1);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_);
    }
  }
  local_30 = 0;
  local_28 = 0;
  _Var1._M_current = (s->_M_dataplus)._M_p;
  local_38 = &local_28;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38,_Var1,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(_Var1._M_current + s->_M_string_length),
             &str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_,"/Users/[user]/",0xe,0);
  std::__cxx11::string::operator=((string *)s,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return s;
}

Assistant:

std::string& str_replPers (std::string& s)
{
    // replace email addresses
    static std::regex reEMail("\\b[A-Z0-9._%+-]+@[A-Z0-9.-]+\\.[A-Z]{2,}\\b", std::regex::icase);
    s = std::regex_replace(s, reEMail, "[email@ano.nym]");
    
    // Replace user's directory name in Linux
    static std::regex reHome("\\/home\\/[-_\\.a-z]+\\/", std::regex::icase);
    s = std::regex_replace(s, reHome, "/home/[user]/");

    // Replace user's directory name in MacOS or Windows
    static std::regex reUsers("[\\/\\\\]Users[\\/\\\\][-_\\.a-z]+[\\/\\\\]", std::regex::icase);
    s = std::regex_replace(s, reUsers, "/Users/[user]/");

    return s;
}